

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSuperChoice(Abc_Ntk_t *pNtk)

{
  Map_Node_t *pMVar1;
  int iVar2;
  void *pvVar3;
  Mio_Library_t *pLib;
  Map_Man_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  Map_Node_t **ppMVar5;
  Abc_Obj_t *pAVar6;
  ProgressBar *p_00;
  Map_Cut_t *p_01;
  int iVar7;
  char *__s;
  long lVar8;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x219,"Abc_Ntk_t *Abc_NtkSuperChoice(Abc_Ntk_t *)");
  }
  pvVar3 = Abc_FrameReadLibGen();
  if (pvVar3 == (void *)0x0) {
    __s = "The current library is not available.";
  }
  else {
    pvVar3 = Abc_FrameReadLibSuper();
    if ((pvVar3 == (void *)0x0) && (pvVar3 = Abc_FrameReadLibGen(), pvVar3 != (void *)0x0)) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Map_SuperLibDeriveFromGenlib(pLib,0);
    }
    iVar2 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar2 != 0) {
      puts("Performing mapping with choices.");
    }
    p = Abc_NtkToMap(pNtk,-1.0,1,(float *)0x0,0);
    if (p == (Map_Man_t *)0x0) {
      return (Abc_Ntk_t *)0x0;
    }
    iVar2 = Map_Mapping(p);
    if (iVar2 == 0) {
      Map_ManFree(p);
      return (Abc_Ntk_t *)0x0;
    }
    for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar2);
      pAVar4->pNext = (Abc_Obj_t *)pAVar4->field_6;
    }
    for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,iVar2);
      pAVar4->pNext = (Abc_Obj_t *)pAVar4->field_6;
    }
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar2);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        pAVar4->pNext = (Abc_Obj_t *)pAVar4->field_6;
      }
    }
    pNtk_00 = Abc_NtkDup(pNtk);
    iVar7 = 0;
    pNtk_01 = Abc_NtkMulti(pNtk_00,0,0x14,0,0,1,0);
    iVar2 = Abc_NtkBddToSop(pNtk_01,-1,1000000000);
    if (iVar2 != 0) {
      for (; iVar7 < pNtk->vCis->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,iVar7);
        pAVar4->field_6 = ((pAVar4->field_6).pCopy)->field_6;
      }
      for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
        pAVar4 = Abc_NtkPo(pNtk,iVar2);
        pAVar4->field_6 = ((pAVar4->field_6).pCopy)->field_6;
      }
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar2);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
          pAVar4->field_6 = ((pAVar4->field_6).pCopy)->field_6;
        }
      }
      Abc_NtkDelete(pNtk_00);
      for (lVar8 = 0; lVar8 < pNtk->vCis->nSize; lVar8 = lVar8 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,(int)lVar8);
        ppMVar5 = Map_ManReadInputs(p);
        pMVar1 = ppMVar5[lVar8];
        pAVar6 = Abc_NtkCreateNodeInv(pNtk_01,(pAVar4->field_6).pCopy);
        Map_NodeSetData(pMVar1,0,(char *)pAVar6);
        ppMVar5 = Map_ManReadInputs(p);
        Map_NodeSetData(ppMVar5[lVar8],1,(char *)(pAVar4->field_6).pTemp);
      }
      for (iVar2 = 0; iVar7 = pNtk->vObjs->nSize, iVar2 < iVar7; iVar2 = iVar2 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar2);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
          pMVar1 = (Map_Node_t *)pAVar4->pNext;
          pAVar6 = Abc_NtkCreateNodeInv(pNtk_01,(pAVar4->field_6).pCopy);
          Map_NodeSetData(pMVar1,0,(char *)pAVar6);
          Map_NodeSetData((Map_Node_t *)pAVar4->pNext,1,(char *)(pAVar4->field_6).pTemp);
        }
      }
      p_00 = Extra_ProgressBarStart(_stdout,iVar7);
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar2);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar2)) {
            Extra_ProgressBarUpdate_int(p_00,iVar2,(char *)0x0);
          }
          p_01 = Map_NodeReadCuts((Map_Node_t *)pAVar4->pNext);
          while (p_01 = Map_CutReadNext(p_01), p_01 != (Map_Cut_t *)0x0) {
            Abc_NodeFromMapCutPhase(pNtk_01,p_01,0);
            Abc_NodeFromMapCutPhase(pNtk_01,p_01,1);
          }
        }
      }
      Extra_ProgressBarStop(p_00);
      if (pNtk_01 == (Abc_Ntk_t *)0x0) {
        return (Abc_Ntk_t *)0x0;
      }
      Map_ManFree(p);
      iVar2 = Abc_NtkCheck(pNtk_01);
      if (iVar2 == 0) {
        puts("Abc_NtkMap: The network check has failed.");
        Abc_NtkDelete(pNtk_01);
        return (Abc_Ntk_t *)0x0;
      }
      return pNtk_01;
    }
    __s = "Abc_NtkFromMapSuperChoice(): Converting to SOPs has failed.";
  }
  puts(__s);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkSuperChoice( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;

    Map_Man_t * pMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // check that the library is available
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // derive the supergate library
    if ( Abc_FrameReadLibSuper() == NULL && Abc_FrameReadLibGen() )
    {
//        printf( "A simple supergate library is derived from gate library \"%s\".\n", 
//            Mio_LibraryReadName((Mio_Library_t *)Abc_FrameReadLibGen()) );
        Map_SuperLibDeriveFromGenlib( (Mio_Library_t *)Abc_FrameReadLibGen(), 0 );
    }

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, -1, 1, NULL, 0 );
    if ( pMan == NULL )
        return NULL;
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }

    // reconstruct the network after mapping
    pNtkNew = Abc_NtkFromMapSuperChoice( pMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    Map_ManFree( pMan );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}